

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefifind.cpp
# Opt level: O0

USTATUS __thiscall
UEFIFind::findFileRecursive
          (UEFIFind *this,UModelIndex index,CBString *hexPattern,UINT8 mode,
          set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
          *files)

{
  pointer *ppuVar1;
  UModelIndex index_00;
  bool bVar2;
  UINT8 UVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  char *textPattern;
  size_type sVar7;
  reference pvVar8;
  TreeModel *__s;
  uchar *pattern_00;
  uchar *patternMask_00;
  INTN IVar9;
  pair<std::_Rb_tree_const_iterator<std::pair<UModelIndex,_UModelIndex>_>,_bool> pVar10;
  UModelIndex local_318;
  pair<UModelIndex,_UModelIndex> local_300;
  _Base_ptr local_2d0;
  undefined1 local_2c8;
  UModelIndex local_2c0;
  pair<UModelIndex,_UModelIndex> local_2a8;
  _Base_ptr local_278;
  undefined1 local_270;
  pair<UModelIndex,_UModelIndex> local_268;
  undefined1 local_238 [8];
  UModelIndex parentFile;
  UByteArray local_218;
  long local_1f8;
  INTN offset;
  UINT8 *rawData;
  UByteArray local_1c8;
  UByteArray local_1a8;
  UByteArray local_188;
  UByteArray local_168;
  UByteArray local_148;
  UByteArray local_128;
  UByteArray local_108;
  UByteArray local_e8;
  undefined1 local_c8 [8];
  UByteArray data;
  undefined8 uStack_a0;
  TreeModel *local_98;
  int local_90;
  int i_1;
  bool hasChildren;
  size_t i;
  size_t count;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> patternMask;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pattern;
  char *hexPatternRaw;
  set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
  *files_local;
  UINT8 mode_local;
  CBString *hexPattern_local;
  UEFIFind *this_local;
  
  bVar2 = UModelIndex::isValid(&index);
  if (bVar2) {
    bVar2 = Bstrlib::CBString::isEmpty(hexPattern);
    if (bVar2) {
      this_local = (UEFIFind *)0x1;
    }
    else {
      textPattern = Bstrlib::CBString::toLocal8Bit(hexPattern);
      ppuVar1 = &patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      bVar2 = makePattern(textPattern,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      if (bVar2) {
        i = 0;
        for (_i_1 = 0;
            sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68),
            _i_1 < sVar7; _i_1 = _i_1 + 1) {
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,_i_1
                             );
          if (*pvVar8 == '\0') {
            i = i + 1;
          }
        }
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
        if (i == sVar7) {
          this_local = (UEFIFind *)0x0;
        }
        else {
          iVar4 = TreeModel::rowCount(this->model,&index);
          for (local_90 = 0; iVar5 = TreeModel::rowCount(this->model,&index), local_90 < iVar5;
              local_90 = local_90 + 1) {
            __s = UModelIndex::model(&index);
            UModelIndex::column(&index);
            TreeModel::index((TreeModel *)((long)&data.d.field_2 + 8),(char *)__s,local_90);
            index_00.i = uStack_a0;
            index_00.r = data.d.field_2._8_4_;
            index_00.c = data.d.field_2._12_4_;
            index_00.m = local_98;
            findFileRecursive(this,index_00,hexPattern,mode,files);
          }
          UByteArray::UByteArray((UByteArray *)local_c8);
          if (0 < iVar4) {
            if (mode == '\x01') {
              TreeModel::header(&local_e8,this->model,&index);
              UByteArray::operator=((UByteArray *)local_c8,&local_e8);
              UByteArray::~UByteArray(&local_e8);
            }
            else if (mode == '\x03') {
              TreeModel::header(&local_128,this->model,&index);
              TreeModel::body(&local_148,this->model,&index);
              ::operator+(&local_108,&local_128,&local_148);
              UByteArray::operator=((UByteArray *)local_c8,&local_108);
              UByteArray::~UByteArray(&local_108);
              UByteArray::~UByteArray(&local_148);
              UByteArray::~UByteArray(&local_128);
            }
          }
          else if (mode == '\x01') {
            TreeModel::header(&local_168,this->model,&index);
            UByteArray::operator=((UByteArray *)local_c8,&local_168);
            UByteArray::~UByteArray(&local_168);
          }
          else if (mode == '\x02') {
            TreeModel::body(&local_188,this->model,&index);
            UByteArray::operator=((UByteArray *)local_c8,&local_188);
            UByteArray::~UByteArray(&local_188);
          }
          else {
            TreeModel::header(&local_1c8,this->model,&index);
            TreeModel::body((UByteArray *)&rawData,this->model,&index);
            ::operator+(&local_1a8,&local_1c8,(UByteArray *)&rawData);
            UByteArray::operator=((UByteArray *)local_c8,&local_1a8);
            UByteArray::~UByteArray(&local_1a8);
            UByteArray::~UByteArray((UByteArray *)&rawData);
            UByteArray::~UByteArray(&local_1c8);
          }
          offset = (INTN)UByteArray::constData((UByteArray *)local_c8);
          ppuVar1 = &patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          pattern_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
          patternMask_00 =
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
          sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
          IVar9 = offset;
          iVar6 = UByteArray::size((UByteArray *)local_c8);
          IVar9 = findPattern(pattern_00,patternMask_00,sVar7,(UINT8 *)IVar9,(long)iVar6,0);
          parentFile.m._7_1_ = 0;
          bVar2 = false;
          local_1f8 = IVar9;
          if ((0 < iVar4) && (bVar2 = false, mode == '\x03')) {
            TreeModel::header(&local_218,this->model,&index);
            parentFile.m._7_1_ = 1;
            iVar6 = UByteArray::size(&local_218);
            bVar2 = iVar6 <= IVar9;
          }
          if ((parentFile.m._7_1_ & 1) != 0) {
            UByteArray::~UByteArray(&local_218);
          }
          if (bVar2) {
            local_1f8 = -1;
          }
          if (-1 < local_1f8) {
            UVar3 = TreeModel::type(this->model,&index);
            if (UVar3 == 'B') {
              UModelIndex::UModelIndex(&local_318);
              std::pair<UModelIndex,_UModelIndex>::pair<UModelIndex,_true>
                        (&local_300,&index,&local_318);
              std::
              set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
              ::insert(files,&local_300);
            }
            else {
              TreeModel::findParentOfType((UModelIndex *)local_238,this->model,&index,'B');
              UVar3 = TreeModel::type(this->model,&index);
              if ((UVar3 == 'C') &&
                 (UVar3 = TreeModel::subtype(this->model,&index), UVar3 == '\x18')) {
                std::pair<UModelIndex,_UModelIndex>::pair<UModelIndex_&,_true>
                          (&local_268,(UModelIndex *)local_238,&index);
                pVar10 = std::
                         set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
                         ::insert(files,&local_268);
                local_278 = (_Base_ptr)pVar10.first._M_node;
                local_270 = pVar10.second;
              }
              else {
                UModelIndex::UModelIndex(&local_2c0);
                std::pair<UModelIndex,_UModelIndex>::pair<UModelIndex_&,_UModelIndex,_true>
                          (&local_2a8,(UModelIndex *)local_238,&local_2c0);
                pVar10 = std::
                         set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
                         ::insert(files,&local_2a8);
                local_2d0 = (_Base_ptr)pVar10.first._M_node;
                local_2c8 = pVar10.second;
              }
            }
          }
          this_local = (UEFIFind *)0x0;
          UByteArray::~UByteArray((UByteArray *)local_c8);
        }
      }
      else {
        this_local = (UEFIFind *)0x1;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    this_local = (UEFIFind *)0x0;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS UEFIFind::findFileRecursive(const UModelIndex index, const UString & hexPattern, const UINT8 mode, std::set<std::pair<UModelIndex, UModelIndex> > & files)
{
    if (!index.isValid())
        return U_SUCCESS;

    if (hexPattern.isEmpty())
        return U_INVALID_PARAMETER;

    const char *hexPatternRaw = hexPattern.toLocal8Bit();
    std::vector<UINT8> pattern, patternMask;
    if (!makePattern(hexPatternRaw, pattern, patternMask))
        return U_INVALID_PARAMETER;

    // Check for "all substrings" pattern
    size_t count = 0;
    for (size_t i = 0; i < patternMask.size(); i++)
        if (patternMask[i] == 0)
            count++;
    if (count == patternMask.size())
        return U_SUCCESS;

    bool hasChildren = (model->rowCount(index) > 0);
    for (int i = 0; i < model->rowCount(index); i++) {
        findFileRecursive(index.model()->index(i, index.column(), index), hexPattern, mode, files);
    }

    // TODO: handle a case where an item has both compressed and uncompressed bodies
    UByteArray data;
    if (hasChildren) {
        if (mode == SEARCH_MODE_HEADER)
            data = model->header(index);
        else if (mode == SEARCH_MODE_ALL)
            data = model->header(index) + model->body(index);
    }
    else {
        if (mode == SEARCH_MODE_HEADER)
            data = model->header(index);
        else if (mode == SEARCH_MODE_BODY)
            data = model->body(index);
        else
            data = model->header(index) + model->body(index);
    }

    const UINT8 *rawData = reinterpret_cast<const UINT8 *>(data.constData());
    INTN offset = findPattern(pattern.data(), patternMask.data(), pattern.size(), rawData, data.size(), 0);

    // For patterns that cross header|body boundary, skip patterns entirely located in body, since
    // children search above has already found them.
    if (hasChildren && mode == SEARCH_MODE_ALL && offset >= model->header(index).size()) {
        offset = -1;
    }

    if (offset >= 0) {
        if (model->type(index) != Types::File) {
            UModelIndex parentFile = model->findParentOfType(index, Types::File);
            if (model->type(index) == Types::Section && model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID)
                files.insert(std::pair<UModelIndex, UModelIndex>(parentFile, index));
            else
                files.insert(std::pair<UModelIndex, UModelIndex>(parentFile, UModelIndex()));
        }
        else {
            files.insert(std::pair<UModelIndex, UModelIndex>(index, UModelIndex()));
        }
    }

    return U_SUCCESS;
}